

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O2

void __thiscall cmLinkImplItem::~cmLinkImplItem(cmLinkImplItem *this)

{
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&(this->Backtrace).super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>)
  ;
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}